

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

void regres(int np,int nrbar,double *rbar,double *thetab,double *beta)

{
  double local_48;
  double b1;
  int j;
  int jm;
  int i1;
  int im;
  int i;
  int ithisr;
  double *beta_local;
  double *thetab_local;
  double *rbar_local;
  int nrbar_local;
  int np_local;
  
  im = nrbar + -1;
  jm = np + -1;
  for (i1 = 0; i1 < np; i1 = i1 + 1) {
    local_48 = thetab[jm];
    if (jm != np + -1) {
      b1._4_4_ = np + -1;
      for (b1._0_4_ = 0; b1._0_4_ <= i1 + -1; b1._0_4_ = b1._0_4_ + 1) {
        local_48 = -rbar[im] * beta[b1._4_4_] + local_48;
        im = im + -1;
        b1._4_4_ = b1._4_4_ + -1;
      }
    }
    beta[jm] = local_48;
    jm = jm + -1;
  }
  return;
}

Assistant:

static void regres(int np,int nrbar,double *rbar, double *thetab, double *beta) {
	int ithisr,i,im,i1,jm,j;
	double b1;
	
	ithisr = nrbar-1;
	im = np-1;
	for (i = 0; i < np; ++i) {
		b1 = thetab[im];
		if (im != (np - 1)) {//30
			i1 = i - 1;
			jm = np - 1;
			for (j = 0; j <= i1; ++j) {
				b1 = b1 - rbar[ithisr] * beta[jm];
				ithisr--;
				jm--;
			}
		}//30
		beta[im] = b1;
		im--;
	}
}